

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::expected(Parser *this,char *what)

{
  ostream *poVar1;
  ParseException *this_00;
  char *local_210;
  string local_208 [48];
  undefined1 local_1d8 [56];
  stringstream msg;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar1 = std::operator<<(local_190,"Expected ");
  poVar1 = std::operator<<(poVar1,what);
  poVar1 = std::operator<<(poVar1," on line ");
  Token::Token((Token *)&local_210,&this->currentToken);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," column ");
  Token::Token((Token *)local_1d8,&this->currentToken);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::string::~string((string *)(local_1d8 + 8));
  std::__cxx11::string::~string(local_208);
  this_00 = (ParseException *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  ParseException::ParseException(this_00,local_210);
  __cxa_throw(this_00,&ParseException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::expected(const char* what) {
    std::stringstream msg;
    msg << "Expected " << what << " on line " << token().line << " column " << token().col;
    throw ParseException(msg.str().c_str());
}